

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O0

void __thiscall Node::OutputPrototypes(Node *this,ostream *os)

{
  int iVar1;
  Node *pNVar2;
  ostream *poVar3;
  undefined1 local_40 [40];
  Node *ThisNode;
  ostream *os_local;
  Node *this_local;
  
  local_40._32_8_ = this;
  ThisNode = (Node *)os;
  os_local = (ostream *)this;
  poVar3 = (ostream *)std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"//");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"// Function Prototypes");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"//");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  do {
    if ((Node *)local_40._32_8_ == (Node *)0x0) {
      std::ostream::operator<<(ThisNode,std::endl<char,std::char_traits<char>>);
      return;
    }
    iVar1 = *(int *)local_40._32_8_;
    if (iVar1 == 0x143) {
LAB_00113267:
      VariableList::NewLevel(Variables);
      if (((Node **)(local_40._32_8_ + 0x50))[2] != (Node *)0x0) {
        OutputPrototypes(((Node **)(local_40._32_8_ + 0x50))[2],(ostream *)ThisNode);
      }
      VariableScanOne((Node *)local_40._32_8_,1);
      VariableList::Fixup(Variables);
      pNVar2 = ThisNode;
      OutputNewDefinition_abi_cxx11_((Node *)local_40);
      poVar3 = std::operator<<((ostream *)pNVar2,(string *)local_40);
      poVar3 = std::operator<<(poVar3,";");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_40);
      VariableList::KillLevel(Variables);
    }
    else if (iVar1 == 0x144) {
      if (((Node **)(local_40._32_8_ + 0x50))[2] != (Node *)0x0) {
        OutputPrototypes(((Node **)(local_40._32_8_ + 0x50))[2],(ostream *)ThisNode);
      }
    }
    else if (((iVar1 == 0x14e) || (iVar1 == 0x17c)) || (iVar1 == 0x1a1)) goto LAB_00113267;
    local_40._32_8_ = *(Node **)(local_40._32_8_ + 0x50);
  } while( true );
}

Assistant:

void Node::OutputPrototypes(
	std::ostream& os	/**< iostream to write the C++ code to */
)
{
	Node* ThisNode = this;

	//
	// Output title for prototype section
	//
	os << std::endl <<
		"//" << std::endl <<
		"// Function Prototypes" << std::endl <<
		"//" << std::endl;

	//
	// Go through the level 0 functions
	//
	while(ThisNode != 0)
	{

		switch(ThisNode->Type)
		{
		case BAS_S_PROGRAM:
		case BAS_S_FUNCTION:
		case BAS_S_SUB:
		case BAS_S_HANDLER:

			//
			// Empty variable list
			//
			Variables->NewLevel();

			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}

			//
			// Scan the call parameters
			//
			ThisNode->VariableScanOne(1);
			Variables->Fixup();

			//
			// Output function name
			//
			os << ThisNode->OutputNewDefinition() << ";" << std::endl;

			Variables->KillLevel();

			break;

		case BAS_S_MAINFUNCTION:
			//
			// Handle any DEF*'s that are in there
			//
			if (ThisNode->Block[2] != 0)
			{
				ThisNode->Block[2]->OutputPrototypes(os);
			}
			break;

		}

		ThisNode = ThisNode->Block[0];
	}

	os << std::endl;
}